

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::apply
          (MLCellLinOp *this,int amrlev,int mglev,MultiFab *out,MultiFab *in,BCMode bc_mode,
          StateMode s_mode,MLMGBndry *bndry)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  
  (**(code **)(*in_RDI + 0x238))(in_RDI,in_ESI,in_EDX,in_R8,in_R9D,in_stack_00000008);
  (**(code **)(*in_RDI + 0x240))(in_RDI,in_ESI,in_EDX,in_RCX,in_R8);
  return;
}

Assistant:

void
MLCellLinOp::apply (int amrlev, int mglev, MultiFab& out, MultiFab& in, BCMode bc_mode,
                    StateMode s_mode, const MLMGBndry* bndry) const
{
    BL_PROFILE("MLCellLinOp::apply()");
    applyBC(amrlev, mglev, in, bc_mode, s_mode, bndry);
#ifdef AMREX_SOFT_PERF_COUNTERS
    perf_counters.apply(out);
#endif
    Fapply(amrlev, mglev, out, in);
}